

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O1

Token * __thiscall EOPlus::Lexer::ReadString(Token *__return_storage_ptr__,Lexer *this)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  variant *pvVar4;
  bool bVar5;
  bool bVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  runtime_error *this_00;
  char c;
  string s;
  char local_119;
  string local_118;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  variant local_b0;
  variant local_70;
  
  local_119 = '\0';
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/lex.cpp:124:27)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/lex.cpp:124:27)>
             ::_M_manager;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  bVar5 = GetCharIf(this,&local_119,(function<bool_(char)> *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (bVar5) {
    bVar5 = false;
LAB_0013c3e4:
    do {
      bVar6 = GetChar(this,&local_119);
      if (!bVar6) goto LAB_0013c480;
      if (bVar5) {
        std::__cxx11::string::push_back((char)&local_118);
      }
      else {
        if (local_119 == '\"') goto LAB_0013c480;
        if (local_119 != '\\') {
          if (local_119 == '\n') {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x20);
            local_f8[0] = local_e8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f8,"Unterminated string on previous line","");
            iVar1 = this->row;
            iVar2 = this->col;
            std::runtime_error::runtime_error(this_00,(string *)local_f8);
            *(int *)(this_00 + 0x10) = iVar1;
            *(undefined ***)this_00 = &PTR__runtime_error_001d3678;
            *(int *)(this_00 + 0x18) = iVar2;
            __cxa_throw(this_00,&Lexer_Error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::string::push_back((char)&local_118);
          goto LAB_0013c3e4;
        }
      }
      bVar5 = (bool)(bVar5 ^ 1);
    } while( true );
  }
  util::variant::variant(&local_70);
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->data).val_int = local_70.val_int;
  *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_70._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_70.val_float._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) = local_70.val_float._4_4_;
  (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->data).val_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->data).val_string,
             local_70.val_string._M_dataplus._M_p,
             local_70.val_string._M_dataplus._M_p + local_70.val_string._M_string_length);
  pvVar4 = &local_70;
LAB_0013c4ca:
  paVar7 = &(pvVar4->val_string).field_2;
  (__return_storage_ptr__->data).type = *(var_type *)(&paVar7->_M_allocated_capacity + 3);
  sVar3 = (&paVar7->_M_allocated_capacity)[2];
  (__return_storage_ptr__->data).val_bool = (bool)(char)sVar3;
  (__return_storage_ptr__->data).cache_val[0] = (bool)(char)(sVar3 >> 8);
  (__return_storage_ptr__->data).cache_val[1] = (bool)(char)(sVar3 >> 0x10);
  (__return_storage_ptr__->data).cache_val[2] = (bool)(char)(sVar3 >> 0x18);
  (__return_storage_ptr__->data).cache_val[3] = (bool)(char)(sVar3 >> 0x20);
  *(int3 *)&(__return_storage_ptr__->data).field_0x35 = (int3)(sVar3 >> 0x28);
  __return_storage_ptr__->newlines = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar7->_M_allocated_capacity)[-2] != paVar7) {
    operator_delete((undefined1 *)(&paVar7->_M_allocated_capacity)[-2],
                    paVar7->_M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
LAB_0013c480:
  util::variant::variant(&local_b0,&local_118);
  __return_storage_ptr__->type = String;
  (__return_storage_ptr__->data).val_int = local_b0.val_int;
  *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_b0._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_b0.val_float._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) = local_b0.val_float._4_4_;
  (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->data).val_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->data).val_string,
             local_b0.val_string._M_dataplus._M_p,
             local_b0.val_string._M_dataplus._M_p + local_b0.val_string._M_string_length);
  pvVar4 = &local_b0;
  goto LAB_0013c4ca;
}

Assistant:

Token Lexer::ReadString()
	{
		char c = '\0';
		std::string s;
		bool escape = false;

		if (!this->GetCharIf(c, [](char c) { return c == '"'; }))
			return Token();

		while (this->GetChar(c))
		{
			if (escape)
			{
				switch (c)
				{
					// No real need for any explicit escape codes...
					default: s += c; break;
				};

				escape = false;
			}
			else if (c == '\\')
			{
				escape = true;
			}
			else if (c == '"')
			{
				break;
			}
			else if (c == '\n')
			{
				throw Lexer_Error("Unterminated string on previous line", this->row, this->col);
			}
			else
			{
				s += c;
			}
		}

		return Token(Token::String, s);
	}